

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
deregister_coop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
                *this,nonempty_name_t *name,coop_dereg_reason_t dereg_reason)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  nonempty_name_t local_30;
  
  paVar2 = &local_30.m_nonempty_name.field_2;
  local_30.m_nonempty_name._M_dataplus._M_p = (name->m_nonempty_name)._M_dataplus._M_p;
  paVar1 = &(name->m_nonempty_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.m_nonempty_name._M_dataplus._M_p == paVar1) {
    local_30.m_nonempty_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_30.m_nonempty_name.field_2._8_8_ =
         *(undefined8 *)((long)&(name->m_nonempty_name).field_2 + 8);
    local_30.m_nonempty_name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_30.m_nonempty_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_30.m_nonempty_name._M_string_length = (name->m_nonempty_name)._M_string_length;
  (name->m_nonempty_name)._M_dataplus._M_p = (pointer)paVar1;
  (name->m_nonempty_name)._M_string_length = 0;
  (name->m_nonempty_name).field_2._M_local_buf[0] = '\0';
  so_5::impl::coop_repository_basis_t::deregister_coop
            (&(this->m_coop_repo).super_coop_repository_basis_t,&local_30,dereg_reason);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.m_nonempty_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_30.m_nonempty_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::deregister_coop(
	nonempty_name_t name,
	coop_dereg_reason_t dereg_reason )
	{
		m_coop_repo.deregister_coop( std::move(name), dereg_reason );
	}